

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O3

SQClosure * __thiscall SQClosure::Clone(SQClosure *this)

{
  SQUnsignedInteger *pSVar1;
  long *plVar2;
  uint uVar3;
  uint uVar4;
  SQFunctionProto *func;
  SQWeakRef *pSVar5;
  SQObjectPtr *pSVar6;
  SQObjectPtr *pSVar7;
  long *plVar8;
  long lVar9;
  SQClosure *pSVar10;
  long lVar11;
  long lVar12;
  
  func = this->_function;
  pSVar10 = Create((this->super_SQCollectable)._sharedstate,func,this->_root);
  pSVar5 = this->_env;
  pSVar10->_env = pSVar5;
  if (pSVar5 != (SQWeakRef *)0x0) {
    pSVar1 = &(pSVar5->super_SQRefCounted)._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  if (0 < func->_noutervalues) {
    lVar11 = 8;
    lVar12 = 0;
    do {
      pSVar6 = this->_outervalues;
      pSVar7 = pSVar10->_outervalues;
      uVar3 = *(uint *)((long)pSVar7 + lVar11 + -8);
      plVar8 = *(long **)((long)&(pSVar7->super_SQObject)._type + lVar11);
      lVar9 = *(long *)((long)&(pSVar6->super_SQObject)._type + lVar11);
      *(long *)((long)&(pSVar7->super_SQObject)._type + lVar11) = lVar9;
      uVar4 = *(uint *)((long)pSVar6 + lVar11 + -8);
      *(uint *)((long)pSVar7 + lVar11 + -8) = uVar4;
      if ((uVar4 >> 0x1b & 1) != 0) {
        plVar2 = (long *)(lVar9 + 8);
        *plVar2 = *plVar2 + 1;
      }
      if ((uVar3 >> 0x1b & 1) != 0) {
        plVar2 = plVar8 + 1;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (**(code **)(*plVar8 + 0x10))();
        }
      }
      lVar12 = lVar12 + 1;
      lVar11 = lVar11 + 0x10;
    } while (lVar12 < func->_noutervalues);
  }
  if (0 < func->_ndefaultparams) {
    lVar11 = 8;
    lVar12 = 0;
    do {
      pSVar6 = this->_defaultparams;
      pSVar7 = pSVar10->_defaultparams;
      uVar3 = *(uint *)((long)pSVar7 + lVar11 + -8);
      plVar8 = *(long **)((long)&(pSVar7->super_SQObject)._type + lVar11);
      lVar9 = *(long *)((long)&(pSVar6->super_SQObject)._type + lVar11);
      *(long *)((long)&(pSVar7->super_SQObject)._type + lVar11) = lVar9;
      uVar4 = *(uint *)((long)pSVar6 + lVar11 + -8);
      *(uint *)((long)pSVar7 + lVar11 + -8) = uVar4;
      if ((uVar4 >> 0x1b & 1) != 0) {
        plVar2 = (long *)(lVar9 + 8);
        *plVar2 = *plVar2 + 1;
      }
      if ((uVar3 >> 0x1b & 1) != 0) {
        plVar2 = plVar8 + 1;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (**(code **)(*plVar8 + 0x10))();
        }
      }
      lVar12 = lVar12 + 1;
      lVar11 = lVar11 + 0x10;
    } while (lVar12 < func->_ndefaultparams);
  }
  return pSVar10;
}

Assistant:

SQClosure *Clone()
    {
        SQFunctionProto *f = _function;
        SQClosure * ret = SQClosure::Create(_opt_ss(this),f,_root);
        ret->_env = _env;
        if(ret->_env) __ObjAddRef(ret->_env);
        _COPY_VECTOR(ret->_outervalues,_outervalues,f->_noutervalues);
        _COPY_VECTOR(ret->_defaultparams,_defaultparams,f->_ndefaultparams);
        return ret;
    }